

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.cpp
# Opt level: O2

void __thiscall Automaton::buildIncludesDigraph(Automaton *this)

{
  _Base_ptr *key;
  Name *this_00;
  undefined1 *puVar1;
  bool bVar2;
  iterator iVar3;
  iterator iVar4;
  _Base_ptr p_Var5;
  _List_iterator<State> this_01;
  _List_iterator<std::_List_iterator<QString>_> _Var6;
  iterator other;
  iterator iVar7;
  const_iterator cVar8;
  _List_node_base *extraout_RDX;
  _List_node_base *extraout_RDX_00;
  Name NVar9;
  Name extraout_RDX_01;
  Node<Include> *this_02;
  const_iterator it;
  _Base_ptr p_Var10;
  long in_FS_OFFSET;
  Include data;
  Include data_00;
  pair<QMultiMap<std::_List_iterator<QString>,_std::_List_iterator<Rule>_>::const_iterator,_QMultiMap<std::_List_iterator<QString>,_std::_List_iterator<Rule>_>::const_iterator>
  pVar11;
  const_iterator local_50;
  _List_iterator<State> local_48;
  _List_iterator<QString> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_02 = (Node<Include> *)&this->states;
  do {
    this_02 = *(Node<Include> **)this_02;
    if (this_02 == (Node<Include> *)&this->states) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
    this_00 = &this_02[1].data.nt;
    iVar3._M_node =
         (_Base_ptr)
         QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::begin
                   ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *)this_00);
    while( true ) {
      iVar4 = QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::end
                        ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *)this_00)
      ;
      if ((iterator)iVar3._M_node == iVar4.i._M_node) break;
      local_40._M_node = *(_List_node_base **)(iVar3._M_node + 1);
      bVar2 = Grammar::isNonTerminal(this->_M_grammar,(Name)local_40._M_node);
      if (bVar2) {
        pVar11 = QMultiMap<std::_List_iterator<QString>,_std::_List_iterator<Rule>_>::equal_range
                           (&this->_M_grammar->rule_map,&local_40);
        while (local_50._M_node = (_Base_ptr)pVar11.second.i._M_node, cVar8 = pVar11.first.i._M_node
              , cVar8.i._M_node != (const_iterator)local_50._M_node) {
          p_Var5 = *(_Base_ptr *)((long)cVar8.i._M_node + 0x28);
          p_Var10 = (_Base_ptr)&p_Var5->_M_right;
          this_01._M_node = (_List_node_base *)this_02;
          while (p_Var10 = *(_Base_ptr *)p_Var10, p_Var10 != (_Base_ptr)&p_Var5->_M_right) {
            puVar1 = *(undefined1 **)p_Var10;
            key = &p_Var10->_M_left;
            bVar2 = Grammar::isNonTerminal(this->_M_grammar,(_List_node_base *)p_Var10->_M_left);
            if ((bVar2) &&
               (NVar9._M_node = extraout_RDX,
               (_Base_ptr *)puVar1 == &(*(_Base_ptr *)((long)cVar8.i._M_node + 0x28))->_M_right)) {
LAB_0010bf75:
              data.nt._M_node = NVar9._M_node;
              data.state._M_node = local_40._M_node;
              other = Node<Include>::get(this_02,data);
              data_00.nt._M_node = extraout_RDX_01._M_node;
              data_00.state._M_node = (_List_node_base *)*key;
              iVar7 = Node<Include>::get((Node<Include> *)this_01._M_node,data_00);
              Node<Include>::insertEdge((Node<Include> *)(iVar7._M_node + 1),other);
            }
            else {
              local_48._M_node = (_List_node_base *)0x0;
              this_01 = QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::value
                                  ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>
                                    *)&(((Node<Include> *)((long)this_01._M_node + 0x30))->data).nt,
                                   (_List_iterator<QString> *)key,&local_48);
              bVar2 = Grammar::isNonTerminal(this->_M_grammar,(_List_node_base *)*key);
              if (bVar2) {
                _Var6 = std::
                        __find_if<std::_List_iterator<std::_List_iterator<QString>>,__gnu_cxx::__ops::_Iter_pred<NotNullable>>
                                  (puVar1,&(*(_Base_ptr *)((long)cVar8.i._M_node + 0x28))->_M_right,
                                   this);
                NVar9._M_node = extraout_RDX_00;
                if (_Var6._M_node ==
                    (_List_node_base *)&(*(_Base_ptr *)((long)cVar8.i._M_node + 0x28))->_M_right)
                goto LAB_0010bf75;
              }
            }
            p_Var5 = *(_Base_ptr *)((long)cVar8.i._M_node + 0x28);
          }
          cVar8.i._M_node =
               (const_iterator)std::_Rb_tree_increment((_Rb_tree_node_base *)cVar8.i._M_node);
          pVar11.second.i._M_node = (const_iterator)(const_iterator)local_50._M_node;
          pVar11.first.i._M_node = cVar8.i._M_node;
        }
      }
      iVar3._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar3._M_node);
    }
  } while( true );
}

Assistant:

void Automaton::buildIncludesDigraph ()
{
  for (StatePointer pp = states.begin (); pp != states.end (); ++pp)
    {
      for (Bundle::iterator a = pp->bundle.begin (); a != pp->bundle.end (); ++a)
        {
          Name name = a.key ();

          if (! _M_grammar->isNonTerminal (name))
            continue;

          const auto range = std::as_const(_M_grammar->rule_map).equal_range(name);
          for (auto it = range.first; it != range.second; ++it)
            {
              const RulePointer &rule = *it;
              StatePointer p = pp;

              for (NameList::iterator A = rule->rhs.begin (); A != rule->rhs.end (); ++A)
                {
                  NameList::iterator dot = A;
                  ++dot;

                  if (_M_grammar->isNonTerminal (*A) && dot == rule->rhs.end ())
                    {
                      // found an include edge.
                      IncludesGraph::iterator target = IncludesGraph::get (Include (pp, name));
                      IncludesGraph::iterator source = IncludesGraph::get (Include (p, *A));

                      source->insertEdge (target);

#ifndef QLALR_NO_DEBUG_INCLUDES
                      qerr() << "*** (" << id (p) << ", " << *A << ") includes (" << id (pp) << ", " << *name << ")" << Qt::endl;
#endif // QLALR_NO_DEBUG_INCLUDES

                      continue;
                    }

                  p = p->bundle.value (*A);

                  if (! _M_grammar->isNonTerminal (*A))
                    continue;

                  NameList::iterator first_not_nullable = std::find_if(dot, rule->rhs.end(), NotNullable(this));
                  if (first_not_nullable != rule->rhs.end ())
                    continue;

                  // found an include edge.
                  IncludesGraph::iterator target = IncludesGraph::get (Include (pp, name));
                  IncludesGraph::iterator source = IncludesGraph::get (Include (p, *A));

                  source->insertEdge (target);

#ifndef QLALR_NO_DEBUG_INCLUDES
                  qerr() << "*** (" << id (p) << ", " << *A << ") includes (" << id (pp) << ", " << *name << ")" << Qt::endl;
#endif // QLALR_NO_DEBUG_INCLUDES
                }
            }
        }
    }
}